

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scheme.cpp
# Opt level: O2

cell * implementations::scheme::proc_sub(cell *__return_storage_ptr__,cells *c)

{
  pointer pcVar1;
  scheme *this;
  long lVar2;
  long extraout_RDX;
  long extraout_RDX_00;
  pointer pcVar3;
  string local_40;
  
  pcVar3 = (c->
           super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
           )._M_impl.super__Vector_impl_data._M_start;
  this = (scheme *)atol((pcVar3->val)._M_dataplus._M_p);
  pcVar1 = (c->
           super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  lVar2 = extraout_RDX;
  while (pcVar3 + 1 != pcVar1) {
    lVar2 = atol(pcVar3[1].val._M_dataplus._M_p);
    this = this + -lVar2;
    lVar2 = extraout_RDX_00;
    pcVar3 = pcVar3 + 1;
  }
  str_abi_cxx11_(&local_40,this,lVar2);
  cell::cell(__return_storage_ptr__,Number,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

cell proc_sub(const cells & c)
{
	long n(atol(c[0].val.c_str()));
	for (cellit i = c.begin() + 1; i != c.end(); ++i) n -= atol(i->val.c_str());
	return cell(Number, str(n));
}